

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JPEGImageHandler.cpp
# Opt level: O0

PDFImageXObject * __thiscall
JPEGImageHandler::CreateImageXObjectFromJPGFile
          (JPEGImageHandler *this,string *inJPGFilePath,ObjectIDType inImageXObjectID)

{
  Trace *this_00;
  undefined8 uVar1;
  undefined1 local_90 [8];
  BoolAndJPEGImageInformation imageInformationResult;
  PDFImageXObject *imageXObject;
  ObjectIDType inImageXObjectID_local;
  string *inJPGFilePath_local;
  JPEGImageHandler *this_local;
  
  imageInformationResult.second.PhotoshopYDensity = 0.0;
  RetrieveImageInformation((BoolAndJPEGImageInformation *)local_90,this,inJPGFilePath);
  if ((local_90[0] & 1U) == 0) {
    this_00 = Trace::DefaultTrace();
    uVar1 = std::__cxx11::string::c_str();
    Trace::TraceToLog(this_00,
                      "JPEGImageHandler::CreateImageXObjectJPGFile, unable to retrieve image information for %s"
                      ,uVar1);
  }
  else {
    imageInformationResult.second.PhotoshopYDensity =
         (double)CreateAndWriteImageXObjectFromJPGInformation
                           (this,inJPGFilePath,inImageXObjectID,
                            (JPEGImageInformation *)&imageInformationResult);
  }
  return (PDFImageXObject *)imageInformationResult.second.PhotoshopYDensity;
}

Assistant:

PDFImageXObject* JPEGImageHandler::CreateImageXObjectFromJPGFile(const std::string& inJPGFilePath,ObjectIDType inImageXObjectID)
{
	PDFImageXObject* imageXObject = NULL;

	do
	{
		// retrieve image information
		BoolAndJPEGImageInformation imageInformationResult = RetrieveImageInformation(inJPGFilePath);
		if(!imageInformationResult.first)
		{
			TRACE_LOG1("JPEGImageHandler::CreateImageXObjectJPGFile, unable to retrieve image information for %s",inJPGFilePath.c_str());
			break;
		}

		// Write Image XObject
		imageXObject = CreateAndWriteImageXObjectFromJPGInformation(inJPGFilePath,inImageXObjectID,imageInformationResult.second);

	} while(false);

	return imageXObject;

}